

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Writer * __thiscall el::base::Writer::construct(Writer *this,Logger *logger,bool needLock)

{
  string *loggerId;
  bool needLock_local;
  Logger *logger_local;
  Writer *this_local;
  
  this->m_logger = logger;
  loggerId = Logger::id_abi_cxx11_(logger);
  initializeLogger(this,loggerId,false,needLock);
  MessageBuilder::initialize(&this->m_messageBuilder,this->m_logger);
  return this;
}

Assistant:

Writer& Writer::construct(Logger* logger, bool needLock) {
  m_logger = logger;
  initializeLogger(logger->id(), false, needLock);
  m_messageBuilder.initialize(m_logger);
  return *this;
}